

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

void iutest::TestEnv::ParseCommandLine<char>(int *pargc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char *tmp;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (argv != (char **)0x0) {
    iVar3 = *pargc;
    if (0 < iVar3) {
      iVar5 = 0;
      do {
        lVar4 = (long)iVar5;
        bVar2 = ParseCommandLineElemA(argv[lVar4]);
        if (bVar2) {
          iVar3 = iVar3 + -1;
          if (iVar5 < iVar3) {
            pcVar1 = argv[lVar4];
            do {
              argv[lVar4] = argv[lVar4 + 1];
              argv[lVar4 + 1] = pcVar1;
              lVar4 = lVar4 + 1;
            } while (iVar3 != lVar4);
          }
        }
        else {
          iVar5 = iVar5 + 1;
        }
      } while (iVar5 < iVar3);
    }
    *pargc = iVar3;
  }
  return;
}

Assistant:

static void ParseCommandLine(int* pargc, CharType** argv)
    {
        if( argv == NULL )
        {
            return;
        }
        int argc = *pargc;

        for( int i=0; i < argc; )
        {
            if( ParseCommandLineElem(argv[i]) )
            {
                --argc;
                // 見つかった場合、オプションを末尾に移動
                for( int k=i; k < argc; ++k )
                {
                    CharType* tmp = argv[k];
                    argv[k] = argv[k+1];
                    argv[k+1] = tmp;
                }
            }
            else
            {
                ++i;
            }
        }
        *pargc = argc;
    }